

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_or_null_simplification.cpp
# Opt level: O1

void __thiscall
duckdb::EqualOrNullSimplification::EqualOrNullSimplification
          (EqualOrNullSimplification *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> _Var4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pEVar7;
  templated_unique_single_t and_child;
  templated_unique_single_t op;
  templated_unique_single_t equal_child;
  templated_unique_single_t isnull_child2;
  templated_unique_single_t isnull_child;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_50;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_48;
  _Head_base<0UL,_duckdb::ComparisonExpressionMatcher_*,_false> local_40;
  __uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  local_38;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_30;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> local_28;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_0248b8f8;
  local_48._M_head_impl = (ExpressionMatcher *)operator_new(0x40);
  (local_48._M_head_impl)->expr_class = BOUND_CONJUNCTION;
  ((local_48._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_48._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  (local_48._M_head_impl)->_vptr_ExpressionMatcher =
       (_func_int **)&PTR__ConjunctionExpressionMatcher_024ac458;
  local_48._M_head_impl[1]._vptr_ExpressionMatcher = (_func_int **)0x0;
  *(undefined8 *)&local_48._M_head_impl[1].expr_class = 0;
  local_48._M_head_impl[1].expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  *(undefined4 *)
   &local_48._M_head_impl[1].type.
    super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
    super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
    super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = 4;
  _Var4._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var4._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0248bdb8;
  *(undefined1 *)&_Var4._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0x33;
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_48);
  _Var1._M_head_impl =
       (pCVar5->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar5->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_48);
  pCVar5->policy = SOME;
  local_40._M_head_impl = (ComparisonExpressionMatcher *)operator_new(0x40);
  ((local_40._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_COMPARISON;
  ((local_40._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_40._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  ((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__ComparisonExpressionMatcher_024ac398;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_40._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_40._M_head_impl)->policy = INVALID;
  _Var4._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var4._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0248bdb8;
  *(undefined1 *)&_Var4._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0x19;
  pCVar6 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  _Var1._M_head_impl =
       (pCVar6->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar6->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  pCVar6 = unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ComparisonExpressionMatcher,_std::default_delete<duckdb::ComparisonExpressionMatcher>,_true>
                         *)&local_40);
  pCVar6->policy = SOME;
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_48);
  local_50._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_50);
  if (local_50._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  local_50._M_head_impl = (ComparisonExpressionMatcher *)operator_new(0x40);
  ((local_50._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_CONJUNCTION;
  ((local_50._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_50._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  ((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__ConjunctionExpressionMatcher_024ac458;
  ((local_50._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_50._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_50._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_50._M_head_impl)->policy = INVALID;
  _Var4._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var4._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0248bdb8;
  *(undefined1 *)&_Var4._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0x32;
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  _Var1._M_head_impl =
       (pCVar5->super_ExpressionMatcher).expr_type.
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pCVar5->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  pCVar5->policy = SOME;
  local_30._M_head_impl = (ExpressionMatcher *)operator_new(0x20);
  (local_30._M_head_impl)->_vptr_ExpressionMatcher = (_func_int **)&PTR__ExpressionMatcher_024ac2e0;
  (local_30._M_head_impl)->expr_class = INVALID;
  ((local_30._M_head_impl)->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>)0x0;
  ((local_30._M_head_impl)->type).
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::TypeMatcher_*,_false>)0x0;
  _Var4._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var4._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0248bdb8;
  *(undefined1 *)&_Var4._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0xe;
  pEVar7 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                         *)&local_30);
  _Var1._M_head_impl =
       (pEVar7->expr_type).
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pEVar7->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined ***)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_024ac2e0;
  *(undefined1 *)
   ((long)local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_38._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  _Var4._M_head_impl = (ExpressionTypeMatcher *)operator_new(0x10);
  (_Var4._M_head_impl)->_vptr_ExpressionTypeMatcher =
       (_func_int **)&PTR__ExpressionTypeMatcher_0248bdb8;
  *(undefined1 *)&_Var4._M_head_impl[1]._vptr_ExpressionTypeMatcher = 0xe;
  pEVar7 = unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
                         *)&local_38);
  _Var1._M_head_impl =
       (pEVar7->expr_type).
       super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl;
  (pEVar7->expr_type).
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (ExpressionTypeMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_ExpressionTypeMatcher[1])();
  }
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_30);
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_38);
  pCVar5 = unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::ConjunctionExpressionMatcher,_std::default_delete<duckdb::ConjunctionExpressionMatcher>,_true>
                         *)&local_48);
  local_28._M_head_impl = &(local_50._M_head_impl)->super_ExpressionMatcher;
  local_50._M_head_impl = (ComparisonExpressionMatcher *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pCVar5->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)&local_28);
  if ((ComparisonExpressionMatcher *)local_28._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((ExpressionMatcher *)&(local_28._M_head_impl)->_vptr_ExpressionMatcher)->
      _vptr_ExpressionMatcher[1])();
  }
  _Var3._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ExpressionMatcher *)0x0;
  _Var2._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExpressionMatcher + 8))();
  }
  if (local_38._M_t.
      super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
      .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  if (local_30._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  if (local_50._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_50._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_40._M_head_impl != (ComparisonExpressionMatcher *)0x0) {
    (*((local_40._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
  }
  if (local_48._M_head_impl != (ExpressionMatcher *)0x0) {
    (*(local_48._M_head_impl)->_vptr_ExpressionMatcher[1])();
  }
  return;
}

Assistant:

EqualOrNullSimplification::EqualOrNullSimplification(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on OR conjunction
	auto op = make_uniq<ConjunctionExpressionMatcher>();
	op->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::CONJUNCTION_OR);
	op->policy = SetMatcher::Policy::SOME;

	// equi comparison on one side
	auto equal_child = make_uniq<ComparisonExpressionMatcher>();
	equal_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::COMPARE_EQUAL);
	equal_child->policy = SetMatcher::Policy::SOME;
	op->matchers.push_back(std::move(equal_child));

	// AND conjunction on the other
	auto and_child = make_uniq<ConjunctionExpressionMatcher>();
	and_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::CONJUNCTION_AND);
	and_child->policy = SetMatcher::Policy::SOME;

	// IS NULL tests inside AND
	auto isnull_child = make_uniq<ExpressionMatcher>();
	isnull_child->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::OPERATOR_IS_NULL);
	// I could try to use std::make_uniq for a copy, but it's available from C++14 only
	auto isnull_child2 = make_uniq<ExpressionMatcher>();
	isnull_child2->expr_type = make_uniq<SpecificExpressionTypeMatcher>(ExpressionType::OPERATOR_IS_NULL);
	and_child->matchers.push_back(std::move(isnull_child));
	and_child->matchers.push_back(std::move(isnull_child2));

	op->matchers.push_back(std::move(and_child));
	root = std::move(op);
}